

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure.h
# Opt level: O2

void __thiscall xLearn::DMatrix::CopyFrom(DMatrix *this,DMatrix *matrix)

{
  uint uVar1;
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> *pvVar2;
  uint64 uVar3;
  ostream *poVar4;
  pointer pNVar5;
  index_t i;
  ulong uVar6;
  allocator local_6e;
  allocator local_6d;
  Logger local_6c;
  string local_68;
  string local_48;
  
  if (matrix != (DMatrix *)0x0) {
    Reset(this);
    uVar3 = matrix->hash_value_2;
    this->hash_value_1 = matrix->hash_value_1;
    this->hash_value_2 = uVar3;
    uVar1 = matrix->row_length;
    this->row_length = uVar1;
    local_68._M_dataplus._M_p = (pointer)0x0;
    std::
    vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
    ::resize(&this->row,(ulong)uVar1,(value_type *)&local_68);
    for (uVar6 = 0; uVar6 < this->row_length; uVar6 = uVar6 + 1) {
      pvVar2 = (matrix->row).
               super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar6];
      for (pNVar5 = (pvVar2->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          pNVar5 != *(pointer *)
                     ((long)&(pvVar2->
                             super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>).
                             _M_impl.super__Vector_impl_data + 8); pNVar5 = pNVar5 + 1) {
        AddNode(this,(index_t)uVar6,pNVar5->feat_id,pNVar5->feat_val,pNVar5->field_id);
      }
    }
    std::vector<float,_std::allocator<float>_>::operator=(&this->Y,&matrix->Y);
    std::vector<float,_std::allocator<float>_>::operator=(&this->norm,&matrix->norm);
    this->has_label = matrix->has_label;
    this->pos = matrix->pos;
    return;
  }
  local_6c.severity_ = ERR;
  std::__cxx11::string::string
            ((string *)&local_68,
             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure.h"
             ,&local_6d);
  std::__cxx11::string::string((string *)&local_48,"CopyFrom",&local_6e);
  poVar4 = Logger::Start(ERR,&local_68,0xe7,&local_48);
  poVar4 = std::operator<<(poVar4,"CHECK failed ");
  poVar4 = std::operator<<(poVar4,
                           "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure.h"
                          );
  poVar4 = std::operator<<(poVar4,":");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xe7);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"matrix");
  std::operator<<(poVar4," == NULL \n");
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  Logger::~Logger(&local_6c);
  abort();
}

Assistant:

void CopyFrom(const DMatrix* matrix) {
    CHECK_NOTNULL(matrix);
    this->Reset();
    // Copy hash value
    this->hash_value_1 = matrix->hash_value_1;
    this->hash_value_2 = matrix->hash_value_2;
    // Copy row length
    this->row_length = matrix->row_length;
    this->row.resize(row_length, nullptr);
    // Copy row
    for (index_t i = 0; i < row_length; ++i) {
      SparseRow* rowc = matrix->row[i];
      for (SparseRow::iterator iter = rowc->begin();
           iter != rowc->end(); ++iter) {
        this->AddNode(i, 
                iter->feat_id, 
                iter->feat_val, 
                iter->field_id);
      }
    }
    // Copy y
    this->Y = matrix->Y;
    // Copy norm
    this->norm = matrix->norm;
    // Copy has label
    this->has_label = matrix->has_label;
    // Copy pos
    this->pos = matrix->pos;
  }